

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateServiceMethod
               (MethodDescriptor *method,Printer *printer)

{
  Descriptor *desc;
  string local_50;
  string local_30;
  
  UnderscoresToCamelCase(&local_30,*(string **)method,false);
  desc = MethodDescriptor::input_type(method);
  FullClassName<google::protobuf::Descriptor>(&local_50,desc,false);
  io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
            (printer,"public function ^camel_name^(\\^request_name^ $request);\n\n",
             (char (*) [11])"camel_name",&local_30,(char (*) [13])"request_name",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateServiceMethod(const MethodDescriptor* method,
                           io::Printer* printer) {
  printer->Print(
        "public function ^camel_name^(\\^request_name^ $request);\n\n",
        "camel_name", UnderscoresToCamelCase(method->name(), false),
        "request_name", FullClassName(
          method->input_type(), false)
  );
}